

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

int mixed_make_segment_space_mixer(uint32_t samplerate,mixed_segment *segment)

{
  int iVar1;
  space_mixer_data *data_00;
  mixed_buffer **ppmVar2;
  mixed_channel_configuration *__src;
  space_mixer_data *data;
  mixed_segment *segment_local;
  uint32_t samplerate_local;
  
  data_00 = (space_mixer_data *)(*mixed_calloc)(1,0x5518);
  if (data_00 == (space_mixer_data *)0x0) {
    mixed_err(1);
  }
  else {
    iVar1 = make_fft_window_data(0x800,4,samplerate,&data_00->fft_window_data);
    if (iVar1 != 0) {
      ppmVar2 = (mixed_buffer **)(*mixed_calloc)(2,8);
      data_00->out = ppmVar2;
      if (data_00->out == (mixed_buffer **)0x0) {
        mixed_err(1);
      }
      else {
        __src = mixed_default_channel_configuration('\x02');
        memcpy(&data_00->channels,__src,0x22);
        iVar1 = make_vbap_from_configuration(&data_00->channels,&data_00->vbap);
        if (iVar1 != 0) {
          data_00->direction[2] = 1.0;
          data_00->up[1] = 1.0;
          data_00->soundspeed = 34330.0;
          data_00->doppler_factor = 0.0;
          data_00->min_distance = 10.0;
          data_00->max_distance = 100000.0;
          data_00->rolloff = 0.5;
          data_00->attenuation = attenuation_exponential;
          data_00->volume = 1.0;
          recompute_look_at(data_00);
          segment->free = space_mixer_free;
          segment->info = space_mixer_info;
          segment->start = space_mixer_start;
          segment->mix = (_func_int_mixed_segment_ptr *)&LAB_00105450;
          segment->set_in = space_mixer_set_in;
          segment->get_in = space_mixer_get_in;
          segment->set_out = space_mixer_set_out;
          segment->get_out = space_mixer_get_out;
          segment->set = space_mixer_set;
          segment->get = space_mixer_get;
          segment->data = data_00;
          return 1;
        }
        mixed_err(0x1c);
      }
    }
    free_fft_window_data(&data_00->fft_window_data);
    (*mixed_free)(data_00);
  }
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_space_mixer(uint32_t samplerate, struct mixed_segment *segment){
  struct space_mixer_data *data = mixed_calloc(1, sizeof(struct space_mixer_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  // These factors might need tweaking for efficiency/quality.
  if(!make_fft_window_data(2048, 4, samplerate, &data->fft_window_data)){
    goto cleanup;
  }

  data->out = mixed_calloc(2, sizeof(struct mixed_buffer *));
  if(!data->out){
    mixed_err(MIXED_OUT_OF_MEMORY);
    goto cleanup;
  }

  memcpy(&data->channels, mixed_default_channel_configuration(2), sizeof(struct mixed_channel_configuration));
  if(!make_vbap_from_configuration(&data->channels, &data->vbap)){
    mixed_err(MIXED_INTERNAL_ERROR);
    goto cleanup;
  }

  data->direction[2] = 1.0;      // Facing in Z+ direction
  data->up[1] = 1.0;             // OpenGL-like. Y+ is up.
  data->soundspeed = 34330.0;    // Means units are in [cm].
  data->doppler_factor = 0.0;
  data->min_distance = 10.0;      // That's 10 centimetres.
  data->max_distance = 100000.0;  // That's a kilometre.
  data->rolloff = 0.5;
  data->attenuation = attenuation_exponential;
  data->volume = 1.0;
  recompute_look_at(data);
  
  segment->free = space_mixer_free;
  segment->info = space_mixer_info;
  segment->start = space_mixer_start;
  segment->mix = space_mixer_mix;
  segment->set_in = space_mixer_set_in;
  segment->get_in = space_mixer_get_in;
  segment->set_out = space_mixer_set_out;
  segment->get_out = space_mixer_get_out;
  segment->set = space_mixer_set;
  segment->get = space_mixer_get;
  segment->data = data;
  return 1;

 cleanup:
  free_fft_window_data(&data->fft_window_data);
  mixed_free(data);
  return 0;
}